

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Geometry *pGVar3;
  RTCIntersectArguments *pRVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  byte bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  long lVar25;
  long lVar26;
  byte bVar27;
  ulong uVar28;
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined4 uVar61;
  float fVar62;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar63 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  uint uVar76;
  uint uVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2748;
  int local_26fc;
  ulong local_26f8;
  ulong local_26f0;
  ulong *local_26e8;
  RayQueryContext *local_26e0;
  long local_26d8;
  long local_26d0;
  Scene *local_26c8;
  RTCFilterFunctionNArguments local_26c0;
  float local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  undefined4 local_2684;
  undefined4 local_2680;
  undefined4 local_267c;
  uint local_2678;
  uint local_2674;
  uint local_2670;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_249f;
  float local_2480 [4];
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined4 uStack_2464;
  float local_2460 [4];
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  undefined4 uStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar44 [32];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_26e8 = local_2390;
    local_2398[0] = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar39 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar10 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar36._8_4_ = 0x7fffffff;
    auVar36._0_8_ = 0x7fffffff7fffffff;
    auVar36._12_4_ = 0x7fffffff;
    auVar36 = vandps_avx512vl((undefined1  [16])aVar2,auVar36);
    auVar68._8_4_ = 0x219392ef;
    auVar68._0_8_ = 0x219392ef219392ef;
    auVar68._12_4_ = 0x219392ef;
    uVar31 = vcmpps_avx512vl(auVar36,auVar68,1);
    bVar35 = (bool)((byte)uVar31 & 1);
    auVar37._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * (int)aVar2.x;
    bVar35 = (bool)((byte)(uVar31 >> 1) & 1);
    auVar37._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * (int)aVar2.y;
    bVar35 = (bool)((byte)(uVar31 >> 2) & 1);
    auVar37._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * (int)aVar2.z;
    bVar35 = (bool)((byte)(uVar31 >> 3) & 1);
    auVar37._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * aVar2.field_3.a;
    auVar36 = vrcp14ps_avx512vl(auVar37);
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = 0x3f8000003f800000;
    auVar38._12_4_ = 0x3f800000;
    auVar38 = vfnmadd213ps_avx512vl(auVar37,auVar36,auVar38);
    auVar37 = vfmadd132ps_fma(auVar38,auVar36,auVar36);
    auVar40 = vbroadcastss_avx512vl(auVar37);
    auVar83 = ZEXT3264(auVar40);
    auVar36 = vmovshdup_avx(auVar37);
    auVar40 = vbroadcastsd_avx512vl(auVar36);
    auVar84 = ZEXT3264(auVar40);
    auVar38 = vshufpd_avx(auVar37,auVar37,1);
    auVar44._8_4_ = 2;
    auVar44._0_8_ = 0x200000002;
    auVar44._12_4_ = 2;
    auVar44._16_4_ = 2;
    auVar44._20_4_ = 2;
    auVar44._24_4_ = 2;
    auVar44._28_4_ = 2;
    auVar40 = vpermps_avx512vl(auVar44,ZEXT1632(auVar37));
    auVar85 = ZEXT3264(auVar40);
    fVar57 = auVar37._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar46._4_4_ = fVar57;
    auVar46._0_4_ = fVar57;
    auVar46._8_4_ = fVar57;
    auVar46._12_4_ = fVar57;
    auVar46._16_4_ = fVar57;
    auVar46._20_4_ = fVar57;
    auVar46._24_4_ = fVar57;
    auVar46._28_4_ = fVar57;
    auVar40 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar86 = ZEXT3264(auVar40);
    auVar42 = ZEXT1632(CONCAT412(auVar37._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar37._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar37._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar57))
                                ));
    auVar41 = vpermps_avx512vl(auVar40,auVar42);
    auVar40 = vpermps_avx2(auVar44,auVar42);
    local_26f0 = (ulong)(auVar37._0_4_ < 0.0) << 5;
    local_26f8 = (ulong)(auVar36._0_4_ < 0.0) << 5 | 0x40;
    uVar31 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x80;
    uVar32 = local_26f0 ^ 0x20;
    uVar34 = local_26f8 ^ 0x20;
    uVar61 = auVar10._0_4_;
    auVar60 = ZEXT3264(CONCAT428(uVar61,CONCAT424(uVar61,CONCAT420(uVar61,CONCAT416(uVar61,CONCAT412
                                                  (uVar61,CONCAT48(uVar61,CONCAT44(uVar61,uVar61))))
                                                  ))));
    auVar43._8_4_ = 0x80000000;
    auVar43._0_8_ = 0x8000000080000000;
    auVar43._12_4_ = 0x80000000;
    auVar43._16_4_ = 0x80000000;
    auVar43._20_4_ = 0x80000000;
    auVar43._24_4_ = 0x80000000;
    auVar43._28_4_ = 0x80000000;
    auVar42 = vxorps_avx512vl(auVar46,auVar43);
    auVar87 = ZEXT3264(auVar42);
    auVar41 = vxorps_avx512vl(auVar41,auVar43);
    auVar88 = ZEXT3264(auVar41);
    auVar40 = vxorps_avx512vl(auVar40,auVar43);
    auVar89 = ZEXT3264(auVar40);
    auVar40 = vbroadcastss_avx512vl(auVar39);
    auVar90 = ZEXT3264(auVar40);
    auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar91 = ZEXT3264(auVar40);
    auVar40 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar92 = ZEXT3264(auVar40);
    auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar93 = ZEXT1664(auVar39);
    auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar94 = ZEXT3264(auVar40);
    local_26e0 = context;
LAB_01c67dc5:
    if (local_26e8 != &local_23a0) {
      pfVar1 = (float *)(local_26e8 + -1);
      local_26e8 = local_26e8 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar33 = *local_26e8;
LAB_01c67de2:
        do {
          if ((uVar33 & 8) != 0) goto LAB_01c68148;
          auVar40 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + local_26f0),auVar87._0_32_,
                               auVar83._0_32_);
          auVar41 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + local_26f8),auVar88._0_32_,
                               auVar84._0_32_);
          auVar40 = vpmaxsd_avx2(auVar40,auVar41);
          auVar41 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar31),auVar89._0_32_,
                               auVar85._0_32_);
          auVar41 = vpmaxsd_avx512vl(auVar41,auVar90._0_32_);
          auVar40 = vpmaxsd_avx2(auVar40,auVar41);
          auVar41 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar32),auVar87._0_32_,
                               auVar83._0_32_);
          auVar42 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar34),auVar88._0_32_,
                               auVar84._0_32_);
          auVar41 = vpminsd_avx2(auVar41,auVar42);
          auVar42 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + (uVar31 ^ 0x20)),
                               auVar89._0_32_,auVar85._0_32_);
          auVar42 = vpminsd_avx2(auVar42,auVar60._0_32_);
          auVar41 = vpminsd_avx2(auVar41,auVar42);
          uVar28 = vpcmpd_avx512vl(auVar40,auVar41,2);
          bVar29 = (byte)uVar28;
          if (bVar29 == 0) break;
          auVar41 = *(undefined1 (*) [32])(uVar33 & 0xfffffffffffffff0);
          auVar42 = ((undefined1 (*) [32])(uVar33 & 0xfffffffffffffff0))[1];
          auVar43 = vmovdqa64_avx512vl(auVar91._0_32_);
          auVar43 = vpternlogd_avx512vl(auVar43,auVar40,auVar92._0_32_,0xf8);
          auVar44 = vpcompressd_avx512vl(auVar43);
          auVar45._0_4_ =
               (uint)(bVar29 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar43._0_4_;
          bVar35 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar45._4_4_ = (uint)bVar35 * auVar44._4_4_ | (uint)!bVar35 * auVar43._4_4_;
          bVar35 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar45._8_4_ = (uint)bVar35 * auVar44._8_4_ | (uint)!bVar35 * auVar43._8_4_;
          bVar35 = (bool)((byte)(uVar28 >> 3) & 1);
          auVar45._12_4_ = (uint)bVar35 * auVar44._12_4_ | (uint)!bVar35 * auVar43._12_4_;
          bVar35 = (bool)((byte)(uVar28 >> 4) & 1);
          auVar45._16_4_ = (uint)bVar35 * auVar44._16_4_ | (uint)!bVar35 * auVar43._16_4_;
          bVar35 = (bool)((byte)(uVar28 >> 5) & 1);
          auVar45._20_4_ = (uint)bVar35 * auVar44._20_4_ | (uint)!bVar35 * auVar43._20_4_;
          bVar35 = (bool)((byte)(uVar28 >> 6) & 1);
          auVar45._24_4_ = (uint)bVar35 * auVar44._24_4_ | (uint)!bVar35 * auVar43._24_4_;
          bVar35 = SUB81(uVar28 >> 7,0);
          auVar45._28_4_ = (uint)bVar35 * auVar44._28_4_ | (uint)!bVar35 * auVar43._28_4_;
          auVar43 = vpermt2q_avx512vl(auVar41,auVar45,auVar42);
          uVar33 = auVar43._0_8_;
          bVar29 = bVar29 - 1 & bVar29;
          if (bVar29 != 0) {
            auVar43 = vpshufd_avx2(auVar45,0x55);
            vpermt2q_avx512vl(auVar41,auVar43,auVar42);
            auVar44 = vpminsd_avx2(auVar45,auVar43);
            auVar43 = vpmaxsd_avx2(auVar45,auVar43);
            bVar29 = bVar29 - 1 & bVar29;
            if (bVar29 == 0) {
              auVar44 = vpermi2q_avx512vl(auVar44,auVar41,auVar42);
              uVar33 = auVar44._0_8_;
              auVar41 = vpermt2q_avx512vl(auVar41,auVar43,auVar42);
              *local_26e8 = auVar41._0_8_;
              lVar25 = 8;
              lStack_2748 = 0x10;
            }
            else {
              auVar51 = vpshufd_avx2(auVar45,0xaa);
              vpermt2q_avx512vl(auVar41,auVar51,auVar42);
              auVar46 = vpminsd_avx2(auVar44,auVar51);
              auVar44 = vpmaxsd_avx2(auVar44,auVar51);
              auVar51 = vpminsd_avx2(auVar43,auVar44);
              auVar44 = vpmaxsd_avx2(auVar43,auVar44);
              bVar29 = bVar29 - 1 & bVar29;
              if (bVar29 == 0) {
                auVar43 = vpermi2q_avx512vl(auVar46,auVar41,auVar42);
                uVar33 = auVar43._0_8_;
                auVar43 = vpermt2q_avx512vl(auVar41,auVar44,auVar42);
                *local_26e8 = auVar43._0_8_;
                auVar43 = vpermd_avx2(auVar44,auVar40);
                *(int *)(local_26e8 + 1) = auVar43._0_4_;
                auVar41 = vpermt2q_avx512vl(auVar41,auVar51,auVar42);
                local_26e8[2] = auVar41._0_8_;
                lStack_2748 = 0x18;
                lVar25 = lStack_2748;
                lStack_2748 = 0x20;
                auVar43 = auVar51;
              }
              else {
                auVar43 = vpshufd_avx2(auVar45,0xff);
                vpermt2q_avx512vl(auVar41,auVar43,auVar42);
                auVar50 = vpminsd_avx2(auVar46,auVar43);
                auVar46 = vpmaxsd_avx2(auVar46,auVar43);
                auVar43 = vpminsd_avx2(auVar51,auVar46);
                auVar46 = vpmaxsd_avx2(auVar51,auVar46);
                auVar51 = vpminsd_avx2(auVar44,auVar46);
                auVar44 = vpmaxsd_avx2(auVar44,auVar46);
                bVar29 = bVar29 - 1 & bVar29;
                if (bVar29 != 0) {
                  auVar47 = valignd_avx512vl(auVar45,auVar45,3);
                  auVar48 = vmovdqa64_avx512vl(auVar93._0_32_);
                  auVar46 = vmovdqa64_avx512vl(auVar93._0_32_);
                  auVar49 = vmovdqa64_avx512vl(auVar94._0_32_);
                  auVar50 = vpermt2d_avx512vl(auVar46,auVar94._0_32_,auVar50);
                  auVar46 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar43 = vpermt2d_avx512vl(auVar50,auVar46,auVar43);
                  auVar46 = vpermt2d_avx512vl(auVar43,auVar46,auVar51);
                  auVar43 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar43 = vpermt2d_avx512vl(auVar46,auVar43,auVar44);
                  auVar93 = ZEXT3264(auVar43);
                  bVar27 = bVar29;
                  do {
                    auVar44 = auVar93._0_32_;
                    auVar43 = vpermps_avx512vl(auVar86._0_32_,auVar47);
                    auVar47 = valignd_avx512vl(auVar47,auVar47,1);
                    vpermt2q_avx512vl(auVar41,auVar47,auVar42);
                    bVar27 = bVar27 - 1 & bVar27;
                    uVar17 = vpcmpd_avx512vl(auVar43,auVar44,5);
                    auVar43 = vpmaxsd_avx2(auVar43,auVar44);
                    bVar18 = (byte)uVar17 << 1;
                    auVar44 = valignd_avx512vl(auVar44,auVar44,7);
                    bVar35 = (bool)((byte)uVar17 & 1);
                    bVar5 = (bool)(bVar18 >> 2 & 1);
                    bVar6 = (bool)(bVar18 >> 3 & 1);
                    bVar7 = (bool)(bVar18 >> 4 & 1);
                    bVar8 = (bool)(bVar18 >> 5 & 1);
                    bVar9 = (bool)(bVar18 >> 6 & 1);
                    auVar93 = ZEXT3264(CONCAT428((uint)(bVar18 >> 7) * auVar44._28_4_ |
                                                 (uint)!(bool)(bVar18 >> 7) * auVar43._28_4_,
                                                 CONCAT424((uint)bVar9 * auVar44._24_4_ |
                                                           (uint)!bVar9 * auVar43._24_4_,
                                                           CONCAT420((uint)bVar8 * auVar44._20_4_ |
                                                                     (uint)!bVar8 * auVar43._20_4_,
                                                                     CONCAT416((uint)bVar7 *
                                                                               auVar44._16_4_ |
                                                                               (uint)!bVar7 *
                                                                               auVar43._16_4_,
                                                                               CONCAT412((uint)bVar6
                                                                                         * auVar44.
                                                  _12_4_ | (uint)!bVar6 * auVar43._12_4_,
                                                  CONCAT48((uint)bVar5 * auVar44._8_4_ |
                                                           (uint)!bVar5 * auVar43._8_4_,
                                                           CONCAT44((uint)bVar35 * auVar44._4_4_ |
                                                                    (uint)!bVar35 * auVar43._4_4_,
                                                                    auVar43._0_4_))))))));
                  } while (bVar27 != 0);
                  lVar25 = (ulong)(uint)POPCOUNT((uint)bVar29) + 3;
                  while( true ) {
                    auVar44 = auVar93._0_32_;
                    auVar43 = vpermt2q_avx512vl(auVar41,auVar44,auVar42);
                    uVar33 = auVar43._0_8_;
                    bVar35 = lVar25 == 0;
                    lVar25 = lVar25 + -1;
                    if (bVar35) break;
                    *local_26e8 = uVar33;
                    auVar43 = vpermd_avx2(auVar44,auVar40);
                    *(int *)(local_26e8 + 1) = auVar43._0_4_;
                    auVar43 = valignd_avx512vl(auVar44,auVar44,1);
                    auVar93 = ZEXT3264(auVar43);
                    local_26e8 = local_26e8 + 2;
                  }
                  auVar40 = vmovdqa64_avx512vl(auVar48);
                  auVar93 = ZEXT3264(auVar40);
                  auVar40 = vmovdqa64_avx512vl(auVar49);
                  auVar94 = ZEXT3264(auVar40);
                  goto LAB_01c67de2;
                }
                auVar46 = vpermi2q_avx512vl(auVar50,auVar41,auVar42);
                uVar33 = auVar46._0_8_;
                auVar46 = vpermt2q_avx512vl(auVar41,auVar44,auVar42);
                *local_26e8 = auVar46._0_8_;
                auVar44 = vpermd_avx2(auVar44,auVar40);
                *(int *)(local_26e8 + 1) = auVar44._0_4_;
                auVar44 = vpermt2q_avx512vl(auVar41,auVar51,auVar42);
                local_26e8[2] = auVar44._0_8_;
                auVar44 = vpermd_avx2(auVar51,auVar40);
                *(int *)(local_26e8 + 3) = auVar44._0_4_;
                auVar41 = vpermt2q_avx512vl(auVar41,auVar43,auVar42);
                local_26e8[4] = auVar41._0_8_;
                lVar25 = 0x28;
                lStack_2748 = 0x30;
              }
            }
            auVar40 = vpermd_avx2(auVar43,auVar40);
            *(int *)((long)local_26e8 + lVar25) = auVar40._0_4_;
            local_26e8 = (ulong *)((long)local_26e8 + lStack_2748);
          }
        } while( true );
      }
      goto LAB_01c67dc5;
    }
  }
  return;
LAB_01c68148:
  local_26d0 = (ulong)((uint)uVar33 & 0xf) - 8;
  uVar33 = uVar33 & 0xfffffffffffffff0;
  for (local_26d8 = 0; local_26d8 != local_26d0; local_26d8 = local_26d8 + 1) {
    lVar26 = local_26d8 * 0xe0;
    lVar25 = uVar33 + 0xd0 + lVar26;
    local_2540 = *(undefined8 *)(lVar25 + 0x10);
    uStack_2538 = *(undefined8 *)(lVar25 + 0x18);
    lVar25 = uVar33 + 0xc0 + lVar26;
    local_23c0 = *(undefined8 *)(lVar25 + 0x10);
    uStack_23b8 = *(undefined8 *)(lVar25 + 0x18);
    uStack_23b0 = local_23c0;
    uStack_23a8 = uStack_23b8;
    uStack_2530 = local_2540;
    uStack_2528 = uStack_2538;
    auVar63._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x60 + lVar26);
    auVar63._0_16_ = *(undefined1 (*) [16])(uVar33 + lVar26);
    auVar69._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x70 + lVar26);
    auVar69._0_16_ = *(undefined1 (*) [16])(uVar33 + 0x10 + lVar26);
    auVar72._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x80 + lVar26);
    auVar72._0_16_ = *(undefined1 (*) [16])(uVar33 + 0x20 + lVar26);
    auVar39 = *(undefined1 (*) [16])(uVar33 + 0x30 + lVar26);
    auVar40._16_16_ = auVar39;
    auVar40._0_16_ = auVar39;
    auVar10 = *(undefined1 (*) [16])(uVar33 + 0x40 + lVar26);
    auVar41._16_16_ = auVar10;
    auVar41._0_16_ = auVar10;
    auVar36 = *(undefined1 (*) [16])(uVar33 + 0x50 + lVar26);
    auVar42._16_16_ = auVar36;
    auVar42._0_16_ = auVar36;
    auVar38 = *(undefined1 (*) [16])(uVar33 + 0x90 + lVar26);
    auVar67._16_16_ = auVar38;
    auVar67._0_16_ = auVar38;
    auVar38 = *(undefined1 (*) [16])(uVar33 + 0xa0 + lVar26);
    auVar71._16_16_ = auVar38;
    auVar71._0_16_ = auVar38;
    auVar38 = *(undefined1 (*) [16])(uVar33 + 0xb0 + lVar26);
    auVar74._16_16_ = auVar38;
    auVar74._0_16_ = auVar38;
    auVar40 = vsubps_avx(auVar63,auVar40);
    auVar41 = vsubps_avx(auVar69,auVar41);
    auVar42 = vsubps_avx(auVar72,auVar42);
    auVar43 = vsubps_avx(auVar67,auVar63);
    auVar44 = vsubps_avx(auVar71,auVar69);
    auVar46 = vsubps_avx(auVar74,auVar72);
    auVar52._4_4_ = auVar41._4_4_ * auVar46._4_4_;
    auVar52._0_4_ = auVar41._0_4_ * auVar46._0_4_;
    auVar52._8_4_ = auVar41._8_4_ * auVar46._8_4_;
    auVar52._12_4_ = auVar41._12_4_ * auVar46._12_4_;
    auVar52._16_4_ = auVar41._16_4_ * auVar46._16_4_;
    auVar52._20_4_ = auVar41._20_4_ * auVar46._20_4_;
    auVar52._24_4_ = auVar41._24_4_ * auVar46._24_4_;
    auVar52._28_4_ = auVar39._12_4_;
    auVar38 = vfmsub231ps_fma(auVar52,auVar44,auVar42);
    auVar53._4_4_ = auVar42._4_4_ * auVar43._4_4_;
    auVar53._0_4_ = auVar42._0_4_ * auVar43._0_4_;
    auVar53._8_4_ = auVar42._8_4_ * auVar43._8_4_;
    auVar53._12_4_ = auVar42._12_4_ * auVar43._12_4_;
    auVar53._16_4_ = auVar42._16_4_ * auVar43._16_4_;
    auVar53._20_4_ = auVar42._20_4_ * auVar43._20_4_;
    auVar53._24_4_ = auVar42._24_4_ * auVar43._24_4_;
    auVar53._28_4_ = auVar10._12_4_;
    auVar10 = vfmsub231ps_fma(auVar53,auVar46,auVar40);
    auVar54._4_4_ = auVar40._4_4_ * auVar44._4_4_;
    auVar54._0_4_ = auVar40._0_4_ * auVar44._0_4_;
    auVar54._8_4_ = auVar40._8_4_ * auVar44._8_4_;
    auVar54._12_4_ = auVar40._12_4_ * auVar44._12_4_;
    auVar54._16_4_ = auVar40._16_4_ * auVar44._16_4_;
    auVar54._20_4_ = auVar40._20_4_ * auVar44._20_4_;
    auVar54._24_4_ = auVar40._24_4_ * auVar44._24_4_;
    auVar54._28_4_ = auVar36._12_4_;
    uVar61 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar82._4_4_ = uVar61;
    auVar82._0_4_ = uVar61;
    auVar82._8_4_ = uVar61;
    auVar82._12_4_ = uVar61;
    auVar82._16_4_ = uVar61;
    auVar82._20_4_ = uVar61;
    auVar82._24_4_ = uVar61;
    auVar82._28_4_ = uVar61;
    auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
    auVar47 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
    uVar61 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar51._4_4_ = uVar61;
    auVar51._0_4_ = uVar61;
    auVar51._8_4_ = uVar61;
    auVar51._12_4_ = uVar61;
    auVar51._16_4_ = uVar61;
    auVar51._20_4_ = uVar61;
    auVar51._24_4_ = uVar61;
    auVar51._28_4_ = uVar61;
    auVar51 = vsubps_avx512vl(auVar63,auVar51);
    auVar36 = vfmsub231ps_fma(auVar54,auVar43,auVar41);
    uVar61 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar50._4_4_ = uVar61;
    auVar50._0_4_ = uVar61;
    auVar50._8_4_ = uVar61;
    auVar50._12_4_ = uVar61;
    auVar50._16_4_ = uVar61;
    auVar50._20_4_ = uVar61;
    auVar50._24_4_ = uVar61;
    auVar50._28_4_ = uVar61;
    auVar50 = vsubps_avx512vl(auVar69,auVar50);
    uVar61 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar48._4_4_ = uVar61;
    auVar48._0_4_ = uVar61;
    auVar48._8_4_ = uVar61;
    auVar48._12_4_ = uVar61;
    auVar48._16_4_ = uVar61;
    auVar48._20_4_ = uVar61;
    auVar48._24_4_ = uVar61;
    auVar48._28_4_ = uVar61;
    auVar48 = vsubps_avx512vl(auVar72,auVar48);
    auVar52 = vmulps_avx512vl(auVar49,auVar48);
    auVar52 = vfmsub231ps_avx512vl(auVar52,auVar50,auVar47);
    auVar53 = vmulps_avx512vl(auVar47,auVar51);
    auVar53 = vfmsub231ps_avx512vl(auVar53,auVar48,auVar82);
    auVar54 = vmulps_avx512vl(auVar82,auVar50);
    auVar54 = vfmsub231ps_avx512vl(auVar54,auVar51,auVar49);
    auVar47 = vmulps_avx512vl(ZEXT1632(auVar36),auVar47);
    auVar49 = vfmadd231ps_avx512vl(auVar47,ZEXT1632(auVar10),auVar49);
    local_24c0 = vfmadd231ps_avx512vl(auVar49,ZEXT1632(auVar38),auVar82);
    auVar49._8_4_ = 0x7fffffff;
    auVar49._0_8_ = 0x7fffffff7fffffff;
    auVar49._12_4_ = 0x7fffffff;
    auVar49._16_4_ = 0x7fffffff;
    auVar49._20_4_ = 0x7fffffff;
    auVar49._24_4_ = 0x7fffffff;
    auVar49._28_4_ = 0x7fffffff;
    vandps_avx512vl(local_24c0,auVar49);
    auVar46 = vmulps_avx512vl(auVar46,auVar54);
    auVar44 = vfmadd231ps_avx512vl(auVar46,auVar53,auVar44);
    auVar39 = vfmadd231ps_fma(auVar44,auVar52,auVar43);
    auVar47._8_4_ = 0x80000000;
    auVar47._0_8_ = 0x8000000080000000;
    auVar47._12_4_ = 0x80000000;
    auVar47._16_4_ = 0x80000000;
    auVar47._20_4_ = 0x80000000;
    auVar47._24_4_ = 0x80000000;
    auVar47._28_4_ = 0x80000000;
    auVar43 = vandpd_avx512vl(local_24c0,auVar47);
    uVar76 = auVar43._0_4_;
    auVar70._0_4_ = (float)(uVar76 ^ auVar39._0_4_);
    uVar24 = auVar43._4_4_;
    auVar70._4_4_ = (float)(uVar24 ^ auVar39._4_4_);
    uVar77 = auVar43._8_4_;
    auVar70._8_4_ = (float)(uVar77 ^ auVar39._8_4_);
    uVar30 = auVar43._12_4_;
    auVar70._12_4_ = (float)(uVar30 ^ auVar39._12_4_);
    fVar57 = auVar43._16_4_;
    auVar70._16_4_ = fVar57;
    fVar78 = auVar43._20_4_;
    auVar70._20_4_ = fVar78;
    fVar79 = auVar43._24_4_;
    auVar70._24_4_ = fVar79;
    fVar80 = auVar43._28_4_;
    auVar70._28_4_ = fVar80;
    auVar42 = vmulps_avx512vl(auVar42,auVar54);
    auVar41 = vfmadd231ps_avx512vl(auVar42,auVar41,auVar53);
    auVar39 = vfmadd231ps_fma(auVar41,auVar40,auVar52);
    auVar73._0_4_ = (float)(uVar76 ^ auVar39._0_4_);
    auVar73._4_4_ = (float)(uVar24 ^ auVar39._4_4_);
    auVar73._8_4_ = (float)(uVar77 ^ auVar39._8_4_);
    auVar73._12_4_ = (float)(uVar30 ^ auVar39._12_4_);
    auVar73._16_4_ = fVar57;
    auVar73._20_4_ = fVar78;
    auVar73._24_4_ = fVar79;
    auVar73._28_4_ = fVar80;
    uVar17 = vcmpps_avx512vl(auVar70,ZEXT832(0) << 0x20,5);
    uVar14 = vcmpps_avx512vl(auVar73,ZEXT832(0) << 0x20,5);
    uVar15 = vcmpps_avx512vl(local_24c0,ZEXT832(0) << 0x20,4);
    auVar81._0_4_ = auVar70._0_4_ + auVar73._0_4_;
    auVar81._4_4_ = auVar70._4_4_ + auVar73._4_4_;
    auVar81._8_4_ = auVar70._8_4_ + auVar73._8_4_;
    auVar81._12_4_ = auVar70._12_4_ + auVar73._12_4_;
    auVar81._16_4_ = fVar57 + fVar57;
    auVar81._20_4_ = fVar78 + fVar78;
    auVar81._24_4_ = fVar79 + fVar79;
    auVar81._28_4_ = fVar80 + fVar80;
    uVar16 = vcmpps_avx512vl(auVar81,local_24c0,2);
    local_249f = (byte)uVar17 & (byte)uVar14 & (byte)uVar15 & (byte)uVar16;
    if (local_249f != 0) {
      auVar23._4_4_ = auVar48._4_4_ * auVar36._4_4_;
      auVar23._0_4_ = auVar48._0_4_ * auVar36._0_4_;
      auVar23._8_4_ = auVar48._8_4_ * auVar36._8_4_;
      auVar23._12_4_ = auVar48._12_4_ * auVar36._12_4_;
      auVar23._16_4_ = auVar48._16_4_ * 0.0;
      auVar23._20_4_ = auVar48._20_4_ * 0.0;
      auVar23._24_4_ = auVar48._24_4_ * 0.0;
      auVar23._28_4_ = auVar48._28_4_;
      auVar39 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar10),auVar23);
      auVar39 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar38),ZEXT1632(auVar39));
      local_24e0._0_4_ = (float)(uVar76 ^ auVar39._0_4_);
      local_24e0._4_4_ = (float)(uVar24 ^ auVar39._4_4_);
      local_24e0._8_4_ = (float)(uVar77 ^ auVar39._8_4_);
      local_24e0._12_4_ = (float)(uVar30 ^ auVar39._12_4_);
      local_24e0._16_4_ = fVar57;
      local_24e0._20_4_ = fVar78;
      local_24e0._24_4_ = fVar79;
      local_24e0._28_4_ = fVar80;
      uVar61 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar19._4_4_ = uVar61;
      auVar19._0_4_ = uVar61;
      auVar19._8_4_ = uVar61;
      auVar19._12_4_ = uVar61;
      auVar19._16_4_ = uVar61;
      auVar19._20_4_ = uVar61;
      auVar19._24_4_ = uVar61;
      auVar19._28_4_ = uVar61;
      auVar40 = vmulps_avx512vl(local_24c0,auVar19);
      uVar17 = vcmpps_avx512vl(auVar40,local_24e0,1);
      fVar62 = (ray->super_RayK<1>).tfar;
      auVar20._4_4_ = fVar62;
      auVar20._0_4_ = fVar62;
      auVar20._8_4_ = fVar62;
      auVar20._12_4_ = fVar62;
      auVar20._16_4_ = fVar62;
      auVar20._20_4_ = fVar62;
      auVar20._24_4_ = fVar62;
      auVar20._28_4_ = fVar62;
      auVar40 = vmulps_avx512vl(local_24c0,auVar20);
      uVar14 = vcmpps_avx512vl(local_24e0,auVar40,2);
      local_249f = (byte)uVar17 & (byte)uVar14 & local_249f;
      if (local_249f != 0) {
        auVar40 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
        auVar75 = ZEXT3264(auVar40);
        uVar76 = vextractps_avx(auVar40._0_16_,1);
        auVar40 = vsubps_avx(local_24c0,auVar73);
        local_2520 = vblendps_avx(auVar70,auVar40,0xf0);
        auVar40 = vsubps_avx(local_24c0,auVar70);
        local_2500 = vblendps_avx(auVar73,auVar40,0xf0);
        fVar62 = (float)DAT_01fbac00;
        local_2420._0_4_ = auVar38._0_4_ * fVar62;
        fVar64 = DAT_01fbac00._4_4_;
        local_2420._4_4_ = auVar38._4_4_ * fVar64;
        fVar65 = DAT_01fbac00._8_4_;
        local_2420._8_4_ = auVar38._8_4_ * fVar65;
        fVar66 = DAT_01fbac00._12_4_;
        local_2420._12_4_ = auVar38._12_4_ * fVar66;
        fVar11 = DAT_01fbac00._16_4_;
        local_2420._16_4_ = fVar11 * 0.0;
        fVar12 = DAT_01fbac00._20_4_;
        local_2420._20_4_ = fVar12 * 0.0;
        fVar13 = DAT_01fbac00._24_4_;
        local_2420._24_4_ = fVar13 * 0.0;
        local_2420._28_4_ = 0;
        local_2400._4_4_ = auVar10._4_4_ * fVar64;
        local_2400._0_4_ = auVar10._0_4_ * fVar62;
        local_2400._8_4_ = auVar10._8_4_ * fVar65;
        local_2400._12_4_ = auVar10._12_4_ * fVar66;
        local_2400._16_4_ = fVar11 * 0.0;
        local_2400._20_4_ = fVar12 * 0.0;
        local_2400._24_4_ = fVar13 * 0.0;
        local_2400._28_4_ = 0;
        local_23e0._4_4_ = auVar36._4_4_ * fVar64;
        local_23e0._0_4_ = auVar36._0_4_ * fVar62;
        local_23e0._8_4_ = auVar36._8_4_ * fVar65;
        local_23e0._12_4_ = auVar36._12_4_ * fVar66;
        local_23e0._16_4_ = fVar11 * 0.0;
        local_23e0._20_4_ = fVar12 * 0.0;
        local_23e0._24_4_ = fVar13 * 0.0;
        local_23e0._28_4_ = 0;
        auVar40 = vrcp14ps_avx512vl(local_24c0);
        auVar21._8_4_ = 0x3f800000;
        auVar21._0_8_ = 0x3f8000003f800000;
        auVar21._12_4_ = 0x3f800000;
        auVar21._16_4_ = 0x3f800000;
        auVar21._20_4_ = 0x3f800000;
        auVar21._24_4_ = 0x3f800000;
        auVar21._28_4_ = 0x3f800000;
        auVar41 = vfnmadd213ps_avx512vl(local_24c0,auVar40,auVar21);
        auVar39 = vfmadd132ps_fma(auVar41,auVar40,auVar40);
        fVar62 = auVar39._0_4_;
        fVar64 = auVar39._4_4_;
        local_2440._4_4_ = fVar64 * local_24e0._4_4_;
        local_2440._0_4_ = fVar62 * local_24e0._0_4_;
        fVar65 = auVar39._8_4_;
        local_2440._8_4_ = fVar65 * local_24e0._8_4_;
        fVar66 = auVar39._12_4_;
        local_2440._12_4_ = fVar66 * local_24e0._12_4_;
        local_2440._16_4_ = fVar57 * 0.0;
        local_2440._20_4_ = fVar78 * 0.0;
        local_2440._24_4_ = fVar79 * 0.0;
        local_2440._28_4_ = fVar80;
        auVar60 = ZEXT3264(local_2440);
        local_2480[0] = local_2520._0_4_ * fVar62;
        local_2480[1] = local_2520._4_4_ * fVar64;
        local_2480[2] = local_2520._8_4_ * fVar65;
        local_2480[3] = local_2520._12_4_ * fVar66;
        fStack_2470 = local_2520._16_4_ * 0.0;
        fStack_246c = local_2520._20_4_ * 0.0;
        fStack_2468 = local_2520._24_4_ * 0.0;
        uStack_2464 = auVar40._28_4_;
        local_2460[0] = local_2500._0_4_ * fVar62;
        local_2460[1] = local_2500._4_4_ * fVar64;
        local_2460[2] = local_2500._8_4_ * fVar65;
        local_2460[3] = local_2500._12_4_ * fVar66;
        fStack_2450 = local_2500._16_4_ * 0.0;
        fStack_244c = local_2500._20_4_ * 0.0;
        fStack_2448 = local_2500._24_4_ * 0.0;
        uStack_2444 = auVar40._28_4_;
        auVar58._8_4_ = 0x7f800000;
        auVar58._0_8_ = 0x7f8000007f800000;
        auVar58._12_4_ = 0x7f800000;
        auVar58._16_4_ = 0x7f800000;
        auVar58._20_4_ = 0x7f800000;
        auVar58._24_4_ = 0x7f800000;
        auVar58._28_4_ = 0x7f800000;
        auVar40 = vblendmps_avx512vl(auVar58,local_2440);
        auVar55._0_4_ =
             (uint)(local_249f & 1) * auVar40._0_4_ | (uint)!(bool)(local_249f & 1) * 0x7f800000;
        bVar35 = (bool)(local_249f >> 1 & 1);
        auVar55._4_4_ = (uint)bVar35 * auVar40._4_4_ | (uint)!bVar35 * 0x7f800000;
        bVar35 = (bool)(local_249f >> 2 & 1);
        auVar55._8_4_ = (uint)bVar35 * auVar40._8_4_ | (uint)!bVar35 * 0x7f800000;
        bVar35 = (bool)(local_249f >> 3 & 1);
        auVar55._12_4_ = (uint)bVar35 * auVar40._12_4_ | (uint)!bVar35 * 0x7f800000;
        bVar35 = (bool)(local_249f >> 4 & 1);
        auVar55._16_4_ = (uint)bVar35 * auVar40._16_4_ | (uint)!bVar35 * 0x7f800000;
        bVar35 = (bool)(local_249f >> 5 & 1);
        auVar55._20_4_ = (uint)bVar35 * auVar40._20_4_ | (uint)!bVar35 * 0x7f800000;
        bVar35 = (bool)(local_249f >> 6 & 1);
        auVar55._24_4_ = (uint)bVar35 * auVar40._24_4_ | (uint)!bVar35 * 0x7f800000;
        auVar55._28_4_ =
             (uint)(local_249f >> 7) * auVar40._28_4_ | (uint)!(bool)(local_249f >> 7) * 0x7f800000;
        auVar40 = vshufps_avx(auVar55,auVar55,0xb1);
        auVar40 = vminps_avx(auVar55,auVar40);
        auVar41 = vshufpd_avx(auVar40,auVar40,5);
        auVar40 = vminps_avx(auVar40,auVar41);
        auVar41 = vpermpd_avx2(auVar40,0x4e);
        auVar40 = vminps_avx(auVar40,auVar41);
        uVar17 = vcmpps_avx512vl(auVar55,auVar40,0);
        uVar24 = (uint)local_249f;
        bVar29 = local_249f;
        if ((local_249f & (byte)uVar17) != 0) {
          bVar29 = local_249f & (byte)uVar17;
        }
        uVar77 = 0;
        for (uVar30 = (uint)bVar29; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x80000000) {
          uVar77 = uVar77 + 1;
        }
        local_26c8 = local_26e0->scene;
        do {
          uVar30 = uVar77 & 0xff;
          local_2678 = *(uint *)((long)&local_23c0 + (ulong)uVar30 * 4);
          pGVar3 = (local_26c8->geometries).items[local_2678].ptr;
          if ((pGVar3->mask & uVar76) == 0) {
            uVar24 = (uint)(byte)(~(byte)(1 << (uVar77 & 0x1f)) & (byte)uVar24);
          }
          else {
            pRVar4 = local_26e0->args;
            local_2660 = auVar75._0_32_;
            local_2640 = auVar60._0_32_;
            local_2620 = auVar90._0_32_;
            local_2600 = auVar89._0_32_;
            local_25e0 = auVar88._0_32_;
            local_25c0 = auVar87._0_32_;
            local_25a0 = auVar85._0_32_;
            local_2580 = auVar84._0_32_;
            local_2560 = auVar83._0_32_;
            if (pRVar4->filter == (RTCFilterFunctionN)0x0) {
              local_26c0.context = local_26e0->user;
              if (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar28 = (ulong)(uVar30 << 2);
                fVar57 = *(float *)((long)local_2480 + uVar28);
                fVar78 = *(float *)((long)local_2460 + uVar28);
                (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar28);
                (ray->Ng).field_0.field_0.x = *(float *)(local_2420 + uVar28);
                (ray->Ng).field_0.field_0.y = *(float *)(local_2400 + uVar28);
                (ray->Ng).field_0.field_0.z = *(float *)(local_23e0 + uVar28);
                ray->u = fVar57;
                ray->v = fVar78;
                ray->primID = *(uint *)((long)&local_2540 + uVar28);
                ray->geomID = local_2678;
                ray->instID[0] = (local_26c0.context)->instID[0];
                ray->instPrimID[0] = (local_26c0.context)->instPrimID[0];
                break;
              }
            }
            else {
              local_26c0.context = local_26e0->user;
            }
            uVar28 = (ulong)(uVar30 * 4);
            local_2690 = *(float *)(local_2420 + uVar28);
            local_268c = *(undefined4 *)(local_2400 + uVar28);
            local_2688 = *(undefined4 *)(local_23e0 + uVar28);
            local_2684 = *(undefined4 *)((long)local_2480 + uVar28);
            local_2680 = *(undefined4 *)((long)local_2460 + uVar28);
            local_267c = *(undefined4 *)((long)&local_2540 + uVar28);
            local_2674 = (local_26c0.context)->instID[0];
            local_2670 = (local_26c0.context)->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar28);
            local_26fc = -1;
            local_26c0.valid = &local_26fc;
            local_26c0.geometryUserPtr = pGVar3->userPtr;
            local_26c0.ray = (RTCRayN *)ray;
            local_26c0.hit = (RTCHitN *)&local_2690;
            local_26c0.N = 1;
            if (((pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                ((*pGVar3->intersectionFilterN)(&local_26c0), *local_26c0.valid != 0)) &&
               ((pRVar4->filter == (RTCFilterFunctionN)0x0 ||
                ((((pRVar4->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                   RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar3->field_8).field_0x2 & 0x40) == 0)) ||
                 ((*pRVar4->filter)(&local_26c0), *local_26c0.valid != 0)))))) {
              (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.x =
                   *(float *)local_26c0.hit;
              (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_26c0.hit + 4);
              (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_26c0.hit + 8);
              *(float *)((long)local_26c0.ray + 0x3c) = *(float *)(local_26c0.hit + 0xc);
              *(float *)((long)local_26c0.ray + 0x40) = *(float *)(local_26c0.hit + 0x10);
              *(float *)((long)local_26c0.ray + 0x44) = *(float *)(local_26c0.hit + 0x14);
              *(float *)((long)local_26c0.ray + 0x48) = *(float *)(local_26c0.hit + 0x18);
              *(float *)((long)local_26c0.ray + 0x4c) = *(float *)(local_26c0.hit + 0x1c);
              *(float *)((long)local_26c0.ray + 0x50) = *(float *)(local_26c0.hit + 0x20);
            }
            else {
              (ray->super_RayK<1>).tfar = (float)local_2660._0_4_;
            }
            auVar60 = ZEXT3264(local_2640);
            fVar57 = (ray->super_RayK<1>).tfar;
            auVar22._4_4_ = fVar57;
            auVar22._0_4_ = fVar57;
            auVar22._8_4_ = fVar57;
            auVar22._12_4_ = fVar57;
            auVar22._16_4_ = fVar57;
            auVar22._20_4_ = fVar57;
            auVar22._24_4_ = fVar57;
            auVar22._28_4_ = fVar57;
            uVar17 = vcmpps_avx512vl(local_2640,auVar22,2);
            uVar24 = (uint)(byte)(~(byte)(1 << (uVar77 & 0x1f)) & (byte)uVar24) & (uint)uVar17;
            uVar76 = (ray->super_RayK<1>).mask;
            auVar75 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
            auVar83 = ZEXT3264(local_2560);
            auVar84 = ZEXT3264(local_2580);
            auVar85 = ZEXT3264(local_25a0);
            auVar40 = vbroadcastss_avx512vl(ZEXT416(1));
            auVar86 = ZEXT3264(auVar40);
            auVar87 = ZEXT3264(local_25c0);
            auVar88 = ZEXT3264(local_25e0);
            auVar89 = ZEXT3264(local_2600);
            auVar90 = ZEXT3264(local_2620);
            auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar91 = ZEXT3264(auVar40);
            auVar40 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar92 = ZEXT3264(auVar40);
            auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
            auVar93 = ZEXT1664(auVar39);
            auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar94 = ZEXT3264(auVar40);
          }
          bVar29 = (byte)uVar24;
          if (bVar29 == 0) break;
          auVar59._8_4_ = 0x7f800000;
          auVar59._0_8_ = 0x7f8000007f800000;
          auVar59._12_4_ = 0x7f800000;
          auVar59._16_4_ = 0x7f800000;
          auVar59._20_4_ = 0x7f800000;
          auVar59._24_4_ = 0x7f800000;
          auVar59._28_4_ = 0x7f800000;
          auVar40 = vblendmps_avx512vl(auVar59,auVar60._0_32_);
          auVar56._0_4_ =
               (uint)(bVar29 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar29 & 1) * 0x7f800000;
          bVar35 = (bool)((byte)(uVar24 >> 1) & 1);
          auVar56._4_4_ = (uint)bVar35 * auVar40._4_4_ | (uint)!bVar35 * 0x7f800000;
          bVar35 = (bool)((byte)(uVar24 >> 2) & 1);
          auVar56._8_4_ = (uint)bVar35 * auVar40._8_4_ | (uint)!bVar35 * 0x7f800000;
          bVar35 = (bool)((byte)(uVar24 >> 3) & 1);
          auVar56._12_4_ = (uint)bVar35 * auVar40._12_4_ | (uint)!bVar35 * 0x7f800000;
          bVar35 = (bool)((byte)(uVar24 >> 4) & 1);
          auVar56._16_4_ = (uint)bVar35 * auVar40._16_4_ | (uint)!bVar35 * 0x7f800000;
          bVar35 = (bool)((byte)(uVar24 >> 5) & 1);
          auVar56._20_4_ = (uint)bVar35 * auVar40._20_4_ | (uint)!bVar35 * 0x7f800000;
          bVar35 = (bool)((byte)(uVar24 >> 6) & 1);
          auVar56._24_4_ = (uint)bVar35 * auVar40._24_4_ | (uint)!bVar35 * 0x7f800000;
          auVar56._28_4_ = (uVar24 >> 7) * auVar40._28_4_ | (uint)!SUB41(uVar24 >> 7,0) * 0x7f800000
          ;
          auVar40 = vshufps_avx(auVar56,auVar56,0xb1);
          auVar40 = vminps_avx(auVar56,auVar40);
          auVar41 = vshufpd_avx(auVar40,auVar40,5);
          auVar40 = vminps_avx(auVar40,auVar41);
          auVar41 = vpermpd_avx2(auVar40,0x4e);
          auVar40 = vminps_avx(auVar40,auVar41);
          uVar17 = vcmpps_avx512vl(auVar56,auVar40,0);
          bVar29 = (byte)uVar17 & bVar29;
          uVar30 = uVar24;
          if (bVar29 != 0) {
            uVar30 = (uint)bVar29;
          }
          uVar77 = 0;
          for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x80000000) {
            uVar77 = uVar77 + 1;
          }
        } while( true );
      }
    }
  }
  fVar57 = (ray->super_RayK<1>).tfar;
  auVar60 = ZEXT3264(CONCAT428(fVar57,CONCAT424(fVar57,CONCAT420(fVar57,CONCAT416(fVar57,CONCAT412(
                                                  fVar57,CONCAT48(fVar57,CONCAT44(fVar57,fVar57)))))
                                               )));
  goto LAB_01c67dc5;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }